

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O0

SizeT SPARC_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  int iVar1;
  uint uVar2;
  UInt32 dest;
  UInt32 src;
  UInt32 i;
  int encoding_local;
  UInt32 ip_local;
  SizeT size_local;
  Byte *data_local;
  ulong local_8;
  
  if (size < 4) {
    local_8 = 0;
  }
  else {
    for (i = 0; (ulong)i <= size - 4; i = i + 4) {
      if (((data[i] == '@') && ((data[i + 1] & 0xc0) == 0)) ||
         ((data[i] == '\x7f' && ((data[i + 1] & 0xc0) == 0xc0)))) {
        if (encoding == 0) {
          iVar1 = -(ip + i);
        }
        else {
          iVar1 = ip + i;
        }
        dest = iVar1 + ((uint)data[i + 1] << 0x10 | (uint)data[i + 2] << 8 | (uint)data[i + 3]) * 4;
        iVar1 = (-(dest >> 0x18 & 1) & 0xff) << 0x16;
        uVar2 = dest >> 2 & 0x3fffff;
        data[i] = (byte)((uint)iVar1 >> 0x18) | 0x40;
        data[i + 1] = (byte)((uint)iVar1 >> 0x10) | (byte)(uVar2 >> 0x10);
        data[i + 2] = (Byte)(uVar2 >> 8);
        data[i + 3] = (Byte)uVar2;
      }
    }
    local_8 = (ulong)i;
  }
  return local_8;
}

Assistant:

SizeT SPARC_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  UInt32 i;
  if (size < 4)
    return 0;
  size -= 4;
  for (i = 0; i <= size; i += 4)
  {
    if ((data[i] == 0x40 && (data[i + 1] & 0xC0) == 0x00) ||
        (data[i] == 0x7F && (data[i + 1] & 0xC0) == 0xC0))
    {
      UInt32 src =
        ((UInt32)data[i + 0] << 24) |
        ((UInt32)data[i + 1] << 16) |
        ((UInt32)data[i + 2] << 8) |
        ((UInt32)data[i + 3]);
      UInt32 dest;
      
      src <<= 2;
      if (encoding)
        dest = ip + i + src;
      else
        dest = src - (ip + i);
      dest >>= 2;
      
      dest = (((0 - ((dest >> 22) & 1)) << 22) & 0x3FFFFFFF) | (dest & 0x3FFFFF) | 0x40000000;

      data[i + 0] = (Byte)(dest >> 24);
      data[i + 1] = (Byte)(dest >> 16);
      data[i + 2] = (Byte)(dest >> 8);
      data[i + 3] = (Byte)dest;
    }
  }
  return i;
}